

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O1

void __thiscall
Catch::AutoReg::AutoReg
          (AutoReg *this,unique_ptr<Catch::ITestInvoker> *invoker,SourceLineInfo *lineInfo,
          StringRef *classOrMethod,NameAndTags *nameAndTags)

{
  Singleton<Catch::(anonymous_namespace)::RegistryHub,_Catch::IRegistryHub,_Catch::IMutableRegistryHub>
  *pSVar1;
  StringRef *classOrQualifiedMethodName;
  IMutableRegistryHub *pIVar2;
  unique_ptr<Catch::TestCaseInfo> local_50;
  string local_48;
  
  pSVar1 = Singleton<Catch::(anonymous_namespace)::RegistryHub,_Catch::IRegistryHub,_Catch::IMutableRegistryHub>
           ::getInternal();
  extractClassName_abi_cxx11_(&local_48,(Catch *)classOrMethod,classOrQualifiedMethodName);
  Detail::
  make_unique<Catch::TestCaseInfo,std::__cxx11::string_const&,Catch::NameAndTags_const&,Catch::SourceLineInfo_const&>
            ((Detail *)&local_50,&local_48,nameAndTags,lineInfo);
  pIVar2 = &(pSVar1->super_RegistryHub).super_IMutableRegistryHub;
  (*pIVar2->_vptr_IMutableRegistryHub[4])(pIVar2,&local_50,invoker);
  Detail::unique_ptr<Catch::TestCaseInfo>::~unique_ptr(&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

AutoReg::AutoReg(Detail::unique_ptr<ITestInvoker> invoker, SourceLineInfo const &lineInfo, StringRef const &classOrMethod, NameAndTags const &nameAndTags) noexcept {
        CATCH_TRY{
            getMutableRegistryHub()
                    .registerTest(
                        makeTestCaseInfo(
                            extractClassName(classOrMethod),
                            nameAndTags,
                            lineInfo),
                        std::move(invoker)
                    );
        }